

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

void luaL_traceback(lua_State *L,lua_State *L1,char *msg,int level)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int mark;
  int numlevels;
  int top;
  lua_Debug ar;
  int level_local;
  char *msg_local;
  lua_State *L1_local;
  lua_State *L_local;
  
  ar.i_ci._4_4_ = level;
  iVar1 = lua_gettop(L);
  iVar2 = countlevels(L1);
  iVar3 = 0;
  if (0x16 < iVar2) {
    iVar3 = 0xc;
  }
  if (msg != (char *)0x0) {
    lua_pushfstring(L,"%s\n",msg);
  }
  lua_pushlstring(L,"stack traceback:",0x10);
  while( true ) {
    iVar4 = ar.i_ci._4_4_;
    ar.i_ci._4_4_ = ar.i_ci._4_4_ + 1;
    iVar4 = lua_getstack(L1,iVar4,(lua_Debug *)&numlevels);
    if (iVar4 == 0) break;
    if (ar.i_ci._4_4_ == iVar3) {
      lua_pushlstring(L,"\n\t...",5);
      ar.i_ci._4_4_ = iVar2 + -10;
    }
    else {
      lua_getinfo(L1,"Slnt",(lua_Debug *)&numlevels);
      lua_pushfstring(L,"\n\t%s:",&ar.lastlinedefined);
      if (0 < (int)(uint)ar.source) {
        lua_pushfstring(L,"%d:",(ulong)(uint)ar.source);
      }
      lua_pushlstring(L," in ",4);
      pushfuncname(L,(lua_Debug *)&numlevels);
      if (ar.linedefined._3_1_ != '\0') {
        lua_pushlstring(L,"\n\t(...tail calls...)",0x14);
      }
      iVar4 = lua_gettop(L);
      lua_concat(L,iVar4 - iVar1);
    }
  }
  iVar2 = lua_gettop(L);
  lua_concat(L,iVar2 - iVar1);
  return;
}

Assistant:

LUALIB_API void luaL_traceback (lua_State *L, lua_State *L1,
                                const char *msg, int level) {
  lua_Debug ar;
  int top = lua_gettop(L);
  int numlevels = countlevels(L1);
  int mark = (numlevels > LEVELS1 + LEVELS2) ? LEVELS1 : 0;
  if (msg) lua_pushfstring(L, "%s\n", msg);
  lua_pushliteral(L, "stack traceback:");
  while (lua_getstack(L1, level++, &ar)) {
    if (level == mark) {  /* too many levels? */
      lua_pushliteral(L, "\n\t...");  /* add a '...' */
      level = numlevels - LEVELS2;  /* and skip to last ones */
    }
    else {
      lua_getinfo(L1, "Slnt", &ar);
      lua_pushfstring(L, "\n\t%s:", ar.short_src);
      if (ar.currentline > 0)
        lua_pushfstring(L, "%d:", ar.currentline);
      lua_pushliteral(L, " in ");
      pushfuncname(L, &ar);
      if (ar.istailcall)
        lua_pushliteral(L, "\n\t(...tail calls...)");
      lua_concat(L, lua_gettop(L) - top);
    }
  }
  lua_concat(L, lua_gettop(L) - top);
}